

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadDefaultWireLoadSel(Scl_Tree_t *p)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  Scl_Item_t *local_20;
  Scl_Item_t *pItem;
  Scl_Tree_t *p_local;
  
  pSVar2 = Scl_LibertyRoot(p);
  local_20 = Scl_LibertyItem(p,pSVar2->Child);
  while( true ) {
    if (local_20 == (Scl_Item_t *)0x0) {
      return "";
    }
    iVar1 = Scl_LibertyCompare(p,local_20->Key,"default_wire_load_selection");
    if (iVar1 == 0) break;
    local_20 = Scl_LibertyItem(p,local_20->Next);
  }
  pcVar3 = Scl_LibertyReadString(p,local_20->Head);
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadDefaultWireLoadSel( Scl_Tree_t * p )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "default_wire_load_selection" )
        return Scl_LibertyReadString(p, pItem->Head);
    return "";
}